

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O3

void __thiscall diy::FileStorage::~FileStorage(FileStorage *this)

{
  fast_mutex *pfVar1;
  _Base_ptr p_Var2;
  unique_lock<tthread::fast_mutex> local_38;
  
  (this->super_ExternalStorage)._vptr_ExternalStorage = (_func_int **)&PTR_put_0013b508;
  pfVar1 = &(this->filenames_).m_;
  local_38._M_owns = false;
  local_38._M_device = pfVar1;
  std::unique_lock<tthread::fast_mutex>::lock(&local_38);
  p_Var2 = (this->filenames_).x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_38._M_device != (fast_mutex *)0x0) {
    LOCK();
    (local_38._M_device)->mLock = 0;
    UNLOCK();
  }
  while( true ) {
    local_38._M_owns = false;
    local_38._M_device = pfVar1;
    std::unique_lock<tthread::fast_mutex>::lock(&local_38);
    local_38._M_owns = true;
    if (local_38._M_device != (fast_mutex *)0x0) {
      LOCK();
      (local_38._M_device)->mLock = 0;
      UNLOCK();
    }
    if ((_Rb_tree_header *)p_Var2 == &(this->filenames_).x_._M_t._M_impl.super__Rb_tree_header)
    break;
    remove((char *)p_Var2[1]._M_left);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
               *)&this->filenames_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->filename_templates_);
  return;
}

Assistant:

~FileStorage()
      {
        for (FileRecordMap::const_iterator it =  filenames_.const_access()->begin();
                                           it != filenames_.const_access()->end();
                                         ++it)
        {
          io::utils::remove(it->second.name);
        }
      }